

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_emr_list_execute_plans.cc
# Opt level: O2

int __thiscall
aliyun::Emr::ListExecutePlans
          (Emr *this,EmrListExecutePlansRequestType *req,EmrListExecutePlansResponseType *response,
          EmrErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  uint index;
  allocator<char> local_504;
  allocator<char> local_503;
  allocator<char> local_502;
  allocator<char> local_501;
  Value val;
  undefined1 local_4e8 [8];
  _Alloc_hider local_4e0;
  undefined1 local_4d8 [24];
  _Alloc_hider local_4c0;
  size_type local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  long local_4a0;
  _Alloc_hider local_498;
  size_type local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  bool local_478;
  Int local_474;
  _Alloc_hider local_470;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  Int local_450;
  _Alloc_hider local_448;
  size_type local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  _Alloc_hider local_428;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  EmrListExecutePlansResponseType *local_408;
  string str_response;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"ListExecutePlans",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->strategy)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"Strategy",(allocator<char> *)local_4e8);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->status)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"Status",(allocator<char> *)local_4e8);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->status);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->is_desc)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"IsDesc",(allocator<char> *)local_4e8);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->is_desc);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->page_number)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"PageNumber",(allocator<char> *)local_4e8);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->page_number);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((req->page_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"PageSize",(allocator<char> *)local_4e8);
    std::__cxx11::string::string((string *)&local_3a0,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"RegionId",(allocator<char> *)local_4e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EmrErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_4e8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4e8,anon_var_dwarf_13598b + 9,&local_501);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_4e8);
        std::__cxx11::string::~string((string *)local_4e8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_4e8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4e8,anon_var_dwarf_13598b + 9,&local_502);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_4e8);
        std::__cxx11::string::~string((string *)local_4e8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_4e8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4e8,anon_var_dwarf_13598b + 9,&local_503);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_4e8);
        std::__cxx11::string::~string((string *)local_4e8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_4e8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4e8,anon_var_dwarf_13598b + 9,&local_504);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_4e8);
        std::__cxx11::string::~string((string *)local_4e8);
      }
      if (response != (EmrListExecutePlansResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"TotalCount");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TotalCount");
          IVar3 = Json::Value::asInt(pVVar5);
          response->total_count = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageNumber");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageNumber");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_number = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageSize");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageSize");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_size = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"ExecutePlans");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"ExecutePlans");
          bVar1 = Json::Value::isMember(pVVar5,"ExecutePlanInfo");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"ExecutePlans");
            pVVar5 = Json::Value::operator[](pVVar5,"ExecutePlanInfo");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              local_408 = response;
              for (index = 0; AVar4 = Json::Value::size(pVVar5), index < AVar4; index = index + 1) {
                local_4e0._M_p = local_4d8 + 8;
                local_4d8._0_8_ = 0;
                local_4d8[8] = '\0';
                local_4c0._M_p = (pointer)&local_4b0;
                local_4b8 = 0;
                local_4b0._M_local_buf[0] = '\0';
                local_498._M_p = (pointer)&local_488;
                local_490 = 0;
                local_488._M_local_buf[0] = '\0';
                local_470._M_p = (pointer)&local_460;
                local_468 = 0;
                local_460._M_local_buf[0] = '\0';
                local_448._M_p = (pointer)&local_438;
                local_440 = 0;
                local_438._M_local_buf[0] = '\0';
                local_428._M_p = (pointer)&local_418;
                local_420 = 0;
                local_418._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"Id");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Id");
                  IVar3 = Json::Value::asInt(pVVar7);
                  local_4e8 = (undefined1  [8])(long)IVar3;
                }
                bVar1 = Json::Value::isMember(pVVar6,"Name");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Name");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"LastRunStatus");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"LastRunStatus");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"RunTime");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"RunTime");
                  IVar3 = Json::Value::asInt(pVVar7);
                  local_4a0 = (long)IVar3;
                }
                bVar1 = Json::Value::isMember(pVVar6,"ClusterName");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ClusterName");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_498,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"IsCreateCluster");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"IsCreateCluster");
                  local_478 = Json::Value::asBool(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Stragety");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Stragety");
                  local_474 = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Status");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Status");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_470,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"TimeInterval");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"TimeInterval");
                  local_450 = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"StartTime");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"StartTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_448,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"TimeUnit");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"TimeUnit");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_428,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                std::
                vector<aliyun::EmrListExecutePlansExecutePlanInfoType,_std::allocator<aliyun::EmrListExecutePlansExecutePlanInfoType>_>
                ::push_back(&local_408->execute_plans,(value_type *)local_4e8);
                EmrListExecutePlansExecutePlanInfoType::~EmrListExecutePlansExecutePlanInfoType
                          ((EmrListExecutePlansExecutePlanInfoType *)local_4e8);
              }
            }
          }
        }
      }
      goto LAB_00144e52;
    }
  }
  iVar2 = -1;
  if (error_info != (EmrErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00144e52:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Emr::ListExecutePlans(const EmrListExecutePlansRequestType& req,
                      EmrListExecutePlansResponseType* response,
                       EmrErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListExecutePlans");
  if(!req.strategy.empty()) {
    req_rpc->AddRequestQuery("Strategy", req.strategy);
  }
  if(!req.status.empty()) {
    req_rpc->AddRequestQuery("Status", req.status);
  }
  if(!req.is_desc.empty()) {
    req_rpc->AddRequestQuery("IsDesc", req.is_desc);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}